

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O0

QLibraryScanResult qt_find_pattern(char *s,qsizetype s_len,QString *errMsg)

{
  long lVar1;
  QByteArrayView *in_RDX;
  long in_FS_OFFSET;
  QLibraryScanResult QVar2;
  QString *in_stack_00000078;
  undefined1 in_stack_000001d0 [16];
  qsizetype in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArrayView::QByteArrayView<char,_true>
            (in_RDX,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  QVar2 = QElfParser::parse((QByteArrayView)in_stack_000001d0,in_stack_00000078);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

static QLibraryScanResult qt_find_pattern(const char *s, qsizetype s_len, QString *errMsg)
{
    /*
      We used to search from the end of the file so we'd skip the code and find
      the read-only data that usually follows. Unfortunately, in debug builds,
      the debug sections come after and are usually much bigger than everything
      else, making this process slower than necessary with debug plugins.

      More importantly, the pattern string may exist in the debug information due
      to it being used in the plugin in the first place.
    */
#if defined(Q_OF_ELF)
    return QElfParser::parse({s, s_len}, errMsg);
#elif defined(Q_OF_MACH_O)
    return QMachOParser::parse(s, s_len, errMsg);
#elif defined(Q_OS_WIN) || defined(Q_OS_CYGWIN)
    return QCoffPeParser::parse({s, s_len}, errMsg);
#else
#   warning "Qt does not know how to efficiently parse your platform's binary format; using slow fall-back."
#endif
    static constexpr auto matcher = [] {
        // QPluginMetaData::MagicString is not NUL-terminated, but
        // qMakeStaticByteArrayMatcher requires its argument to be, so
        // duplicate here, but statically check we didn't mess up:
        constexpr auto &pattern = "QTMETADATA !";
        constexpr auto magic = std::string_view(QPluginMetaData::MagicString,
                                                sizeof(QPluginMetaData::MagicString));
        static_assert(pattern == magic);
        return qMakeStaticByteArrayMatcher(pattern);
    }();
    qsizetype i = matcher.indexIn({s, s_len});
    if (i < 0) {
        *errMsg = QLibrary::tr("'%1' is not a Qt plugin").arg(*errMsg);
        return QLibraryScanResult{};
    }
    i += sizeof(QPluginMetaData::MagicString);
    return { i, s_len - i };
}